

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

VerifySignResponseStruct * __thiscall
cfd::js::api::json::VerifySignResponse::ConvertToStruct
          (VerifySignResponseStruct *__return_storage_ptr__,VerifySignResponse *this)

{
  _Rb_tree_header *p_Var1;
  vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  local_58;
  vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  local_38;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->fail_txins).
           super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->fail_txins).
           super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->fail_txins).
  super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->fail_txins).
  super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->success = this->success_;
  core::JsonObjectVector<cfd::js::api::json::FailSignTxIn,_cfd::js::api::FailSignTxInStruct>::
  ConvertToStruct(&local_58,&this->fail_txins_);
  local_38.
  super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__return_storage_ptr__->fail_txins).
       super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->fail_txins).
  super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.
  super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__return_storage_ptr__->fail_txins).
       super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (__return_storage_ptr__->fail_txins).
       super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->fail_txins).
  super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->fail_txins).
  super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>::
  ~vector(&local_38);
  std::vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>::
  ~vector(&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

VerifySignResponseStruct VerifySignResponse::ConvertToStruct() const {  // NOLINT
  VerifySignResponseStruct result;
  result.success = success_;
  result.fail_txins = fail_txins_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}